

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::InterlockedResourceAccessHandler
          (InterlockedResourceAccessHandler *this,Compiler *compiler_,uint32_t entry_point_id)

{
  uint local_4;
  
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__InterlockedResourceAccessHandler_00465738;
  this->compiler = compiler_;
  this->in_crit_sec = false;
  (this->call_stack).super_VectorView<unsigned_int>.buffer_size = 0;
  this->interlock_function_id = 0;
  this->split_function_case = false;
  this->control_flow_interlock = false;
  this->use_critical_section = false;
  this->call_stack_is_interlocked = false;
  (this->call_stack).super_VectorView<unsigned_int>.ptr = (uint *)&(this->call_stack).stack_storage;
  (this->call_stack).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::push_back(&this->call_stack,&local_4);
  return;
}

Assistant:

InterlockedResourceAccessHandler(Compiler &compiler_, uint32_t entry_point_id)
		    : compiler(compiler_)
		{
			call_stack.push_back(entry_point_id);
		}